

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::base::internal::OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>::
MoveAssign<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>
          (OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>> *this,
          OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>_> *other)

{
  if ((other->storage_).
      super_OptionalStorageBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>,_false>.
      is_populated_ == true) {
    InitOrAssign<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>
              (this,&(other->storage_).
                     super_OptionalStorageBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>,_false>
                     .field_1.value_);
    return;
  }
  if (*this == (OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>)0x1) {
    ::std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)(this + 8));
    *this = (OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>)0x0;
  }
  return;
}

Assistant:

void MoveAssign(OptionalBase<U>&& other) {
    if (other.storage_.is_populated_)
      InitOrAssign(std::move(other.storage_.value_));
    else
      FreeIfNeeded();
  }